

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O2

string * __thiscall
testing::(anonymous_namespace)::FormatTimes_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int n)

{
  ostream *poVar1;
  int iVar2;
  char *pcVar3;
  stringstream ss;
  allocator local_1a0 [16];
  undefined1 local_190 [376];
  
  iVar2 = (int)this;
  if (iVar2 == 2) {
    pcVar3 = "twice";
  }
  else {
    if (iVar2 != 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
      poVar1 = (ostream *)std::ostream::operator<<(local_190,iVar2);
      std::operator<<(poVar1," times");
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      return __return_storage_ptr__;
    }
    pcVar3 = "once";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string FormatTimes(int n) {
  if (n == 1) {
    return "once";
  } else if (n == 2) {
    return "twice";
  } else {
    std::stringstream ss;
    ss << n << " times";
    return ss.str();
  }
}